

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O0

void __thiscall cmMakefileProfilingData::~cmMakefileProfilingData(cmMakefileProfilingData *this)

{
  byte bVar1;
  cmMakefileProfilingData *this_local;
  
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)this,"]");
    std::ofstream::close();
  }
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&this->JsonWriter);
  std::ofstream::~ofstream(this);
  return;
}

Assistant:

cmMakefileProfilingData::~cmMakefileProfilingData() noexcept
{
  if (this->ProfileStream.good()) {
    try {
      this->ProfileStream << "]";
      this->ProfileStream.close();
    } catch (...) {
      cmSystemTools::Error("Error writing profiling output!");
    }
  }
}